

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O3

int __thiscall IfNeuron::addStimulus(IfNeuron *this,StochasticVariable *stochvar)

{
  int iVar1;
  Scalar *this_00;
  string local_70;
  string local_50;
  
  this_00 = (Scalar *)operator_new(0x150);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"1.0","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Scalar","");
  Scalar::Scalar(this_00,1.0,&local_70,&local_50);
  iVar1 = DifferentialEquation::addTerm
                    (&this->ifneuronMembrane,(StochasticFunction *)this_00,stochvar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int IfNeuron::addStimulus( StochasticVariable *stochvar )
{
	return ifneuronMembrane.addTerm( new Scalar( 1.0, "1.0" ), stochvar );
}